

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O0

void __thiscall xray_re::mp_rpoint_io::operator()(mp_rpoint_io *this,mp_rpoint *rpoint,xr_writer *w)

{
  xr_writer *w_local;
  mp_rpoint *rpoint_local;
  mp_rpoint_io *this_local;
  
  xr_writer::w_fvector3(w,&rpoint->p);
  xr_writer::w_fvector3(w,&rpoint->a);
  xr_writer::w_u8(w,rpoint->team);
  xr_writer::w_u8(w,rpoint->respawn);
  xr_writer::w_u8(w,rpoint->game);
  xr_writer::w_u8(w,'\0');
  return;
}

Assistant:

void mp_rpoint_io::operator()(const mp_rpoint* rpoint, xr_writer& w) const {
	w.w_fvector3(rpoint->p);
	w.w_fvector3(rpoint->a);
	w.w_u8(rpoint->team);
	w.w_u8(rpoint->respawn);
	w.w_u8(rpoint->game);
	w.w_u8(0);
}